

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddInstallNamePatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmMakefile *this_00;
  string *psVar4;
  ulong uVar5;
  cmComputeLinkInformation *this_01;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *this_02;
  reference ppcVar6;
  mapped_type *this_03;
  ostream *poVar7;
  reference ppVar8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  string for_install_1;
  string for_build_1;
  string new_id;
  string fname;
  string local_148;
  undefined1 local_128 [8];
  string for_install;
  string for_build;
  cmGeneratorTarget *tgt;
  iterator __end2;
  iterator __begin2;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range2;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *sharedLibs;
  cmComputeLinkInformation *cli;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  install_name_remap;
  allocator<char> local_71;
  string local_70;
  string local_50 [8];
  string installNameTool;
  string *toDestDirPath_local;
  string *config_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  if ((((this->ImportLibrary & 1U) == 0) && (this->NamelinkMode != NamelinkModeOnly)) &&
     ((installNameTool.field_2._8_8_ = toDestDirPath,
      TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == SHARED_LIBRARY ||
      ((TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == MODULE_LIBRARY ||
       (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == EXECUTABLE)))))) {
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_INSTALL_NAME_TOOL",&local_71);
    psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_70);
    std::__cxx11::string::string(local_50,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&cli);
      this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
      if (this_01 != (cmComputeLinkInformation *)0x0) {
        this_02 = cmComputeLinkInformation::GetSharedLibrariesLinked(this_01);
        __end2 = std::
                 set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin(this_02);
        tgt = (cmGeneratorTarget *)
              std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::end(this_02);
        while (bVar2 = std::operator!=(&__end2,(_Self *)&tgt), bVar2) {
          ppcVar6 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end2);
          pcVar1 = *ppcVar6;
          bVar2 = cmGeneratorTarget::IsImported(pcVar1);
          if (!bVar2) {
            cmGeneratorTarget::GetInstallNameDirForBuildTree
                      ((string *)((long)&for_install.field_2 + 8),pcVar1,config);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_148,"${CMAKE_INSTALL_PREFIX}",
                       (allocator<char> *)(fname.field_2._M_local_buf + 0xf));
            cmGeneratorTarget::GetInstallNameDirForInstallTree
                      ((string *)local_128,pcVar1,config,&local_148);
            std::__cxx11::string::~string((string *)&local_148);
            std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&for_install.field_2 + 8),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_128);
            if (bVar2) {
              GetInstallFilename((string *)((long)&new_id.field_2 + 8),pcVar1,config,NameSO);
              std::__cxx11::string::operator+=
                        ((string *)(for_install.field_2._M_local_buf + 8),
                         (string *)(new_id.field_2._M_local_buf + 8));
              std::__cxx11::string::operator+=
                        ((string *)local_128,(string *)(new_id.field_2._M_local_buf + 8));
              this_03 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&cli,(key_type *)((long)&for_install.field_2 + 8));
              std::__cxx11::string::operator=((string *)this_03,(string *)local_128);
              std::__cxx11::string::~string((string *)(new_id.field_2._M_local_buf + 8));
            }
            std::__cxx11::string::~string((string *)local_128);
            std::__cxx11::string::~string((string *)(for_install.field_2._M_local_buf + 8));
          }
          std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end2);
        }
      }
      std::__cxx11::string::string((string *)(for_build_1.field_2._M_local_buf + 8));
      TVar3 = cmGeneratorTarget::GetType(this->Target);
      if (TVar3 == SHARED_LIBRARY) {
        cmGeneratorTarget::GetInstallNameDirForBuildTree
                  ((string *)((long)&for_install_1.field_2 + 8),this->Target,config);
        pcVar1 = this->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,"${CMAKE_INSTALL_PREFIX}",&local_1f1);
        cmGeneratorTarget::GetInstallNameDirForInstallTree
                  ((string *)local_1d0,pcVar1,config,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
        bVar2 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
        if (bVar2) {
          std::__cxx11::string::empty();
        }
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&for_install_1.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1d0);
        if (bVar2) {
          GetInstallFilename(&local_238,this->Target,config,NameSO);
          cmStrCat<std::__cxx11::string&,std::__cxx11::string>
                    (&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     &local_238);
          std::__cxx11::string::operator=
                    ((string *)(for_build_1.field_2._M_local_buf + 8),(string *)&local_218);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_238);
        }
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::string::~string((string *)(for_install_1.field_2._M_local_buf + 8));
      }
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) ||
         (bVar2 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&cli), !bVar2)) {
        poVar7 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        poVar7 = std::operator<<(poVar7,"execute_process(COMMAND \"");
        std::operator<<(poVar7,local_50);
        std::operator<<(os,"\"");
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          poVar7 = std::operator<<(os,"\n");
          poVar7 = ::operator<<(poVar7,(cmScriptGeneratorIndent)indent.Level);
          poVar7 = std::operator<<(poVar7,"  -id \"");
          poVar7 = std::operator<<(poVar7,(string *)(for_build_1.field_2._M_local_buf + 8));
          std::operator<<(poVar7,"\"");
        }
        __end2_1 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&cli);
        i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&cli);
        while (bVar2 = std::operator!=(&__end2_1,(_Self *)&i), bVar2) {
          ppVar8 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&__end2_1);
          poVar7 = std::operator<<(os,"\n");
          poVar7 = ::operator<<(poVar7,(cmScriptGeneratorIndent)indent.Level);
          poVar7 = std::operator<<(poVar7,"  -change \"");
          poVar7 = std::operator<<(poVar7,(string *)ppVar8);
          poVar7 = std::operator<<(poVar7,"\" \"");
          poVar7 = std::operator<<(poVar7,(string *)&ppVar8->second);
          std::operator<<(poVar7,"\"");
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++(&__end2_1);
        }
        poVar7 = std::operator<<(os,"\n");
        poVar7 = ::operator<<(poVar7,(cmScriptGeneratorIndent)indent.Level);
        poVar7 = std::operator<<(poVar7,"  \"");
        poVar7 = std::operator<<(poVar7,(string *)installNameTool.field_2._8_8_);
        std::operator<<(poVar7,"\")\n");
      }
      std::__cxx11::string::~string((string *)(for_build_1.field_2._M_local_buf + 8));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&cli);
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
    }
    else {
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    }
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddInstallNamePatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  if (this->ImportLibrary || this->NamelinkMode == NamelinkModeOnly ||
      !(this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::EXECUTABLE)) {
    return;
  }

  // Fix the install_name settings in installed binaries.
  std::string installNameTool =
    this->Target->Target->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  if (installNameTool.empty()) {
    return;
  }

  // Build a map of build-tree install_name to install-tree install_name for
  // shared libraries linked to this target.
  std::map<std::string, std::string> install_name_remap;
  if (cmComputeLinkInformation* cli =
        this->Target->GetLinkInformation(config)) {
    std::set<cmGeneratorTarget const*> const& sharedLibs =
      cli->GetSharedLibrariesLinked();
    for (cmGeneratorTarget const* tgt : sharedLibs) {
      // The install_name of an imported target does not change.
      if (tgt->IsImported()) {
        continue;
      }

      // If the build tree and install tree use different path
      // components of the install_name field then we need to create a
      // mapping to be applied after installation.
      std::string for_build = tgt->GetInstallNameDirForBuildTree(config);
      std::string for_install = tgt->GetInstallNameDirForInstallTree(
        config, "${CMAKE_INSTALL_PREFIX}");
      if (for_build != for_install) {
        // The directory portions differ.  Append the filename to
        // create the mapping.
        std::string fname = this->GetInstallFilename(tgt, config, NameSO);

        // Map from the build-tree install_name.
        for_build += fname;

        // Map to the install-tree install_name.
        for_install += fname;

        // Store the mapping entry.
        install_name_remap[for_build] = for_install;
      }
    }
  }

  // Edit the install_name of the target itself if necessary.
  std::string new_id;
  if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string for_build =
      this->Target->GetInstallNameDirForBuildTree(config);
    std::string for_install = this->Target->GetInstallNameDirForInstallTree(
      config, "${CMAKE_INSTALL_PREFIX}");

    if (this->Target->IsFrameworkOnApple() && for_install.empty()) {
      // Frameworks seem to have an id corresponding to their own full
      // path.
      // ...
      // for_install = fullDestPath_without_DESTDIR_or_name;
    }

    // If the install name will change on installation set the new id
    // on the installed file.
    if (for_build != for_install) {
      // Prepare to refer to the install-tree install_name.
      new_id = cmStrCat(
        for_install, this->GetInstallFilename(this->Target, config, NameSO));
    }
  }

  // Write a rule to run install_name_tool to set the install-tree
  // install_name value and references.
  if (!new_id.empty() || !install_name_remap.empty()) {
    os << indent << "execute_process(COMMAND \"" << installNameTool;
    os << "\"";
    if (!new_id.empty()) {
      os << "\n" << indent << "  -id \"" << new_id << "\"";
    }
    for (auto const& i : install_name_remap) {
      os << "\n"
         << indent << "  -change \"" << i.first << "\" \"" << i.second << "\"";
    }
    os << "\n" << indent << "  \"" << toDestDirPath << "\")\n";
  }
}